

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  u32 x;
  int iVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  u8 *puVar8;
  CellInfo info;
  CellInfo local_48;
  
  if ((int)CONCAT71(in_register_00000009,eType) == 4) {
    uVar6 = *(uint *)pPage->aData;
    if ((uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) == iFrom)
    {
      *(Pgno *)pPage->aData =
           iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
      return 0;
    }
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf2fb,
                "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
    return 0xb;
  }
  iVar4 = btreeInitPage(pPage);
  uVar5 = 0;
  if (iVar4 == 0) {
    uVar1 = pPage->nCell;
    if (uVar1 != 0) {
      uVar6 = iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
      uVar5 = 0;
      do {
        puVar7 = (uint *)(pPage->aData +
                         (CONCAT11(pPage->aCellIdx[uVar5 * 2],pPage->aCellIdx[uVar5 * 2 + 1]) &
                         pPage->maskPage));
        if (eType == '\x03') {
          (*pPage->xParseCell)(pPage,(u8 *)puVar7,&local_48);
          iVar4 = 0;
          if (local_48.nLocal < local_48.nPayload) {
            puVar8 = (u8 *)((long)puVar7 + (ulong)local_48.nSize);
            if (pPage->aData + pPage->pBt->usableSize < puVar8) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf30e,
                          "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
              iVar4 = 1;
            }
            else {
              uVar2 = *(uint *)(puVar8 + -4);
              iVar4 = 0;
              if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
                  == iFrom) {
                *(uint *)(puVar8 + -4) = uVar6;
                goto LAB_0012a5ef;
              }
            }
          }
        }
        else {
          uVar2 = *puVar7;
          iVar4 = 0;
          if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
              iFrom) {
            *puVar7 = uVar6;
LAB_0012a5ef:
            iVar4 = 2;
          }
        }
        if (iVar4 != 0) {
          if (iVar4 == 2) goto LAB_0012a640;
          iVar4 = 0xb;
          goto LAB_0012a4e3;
        }
        uVar5 = uVar5 + 1;
      } while ((uint)uVar1 != uVar5);
      uVar5 = (ulong)(uint)uVar1;
    }
LAB_0012a640:
    iVar4 = 0xb;
    bVar3 = true;
    if ((uint)uVar5 == (uint)uVar1) {
      if (eType == '\x05') {
        uVar6 = *(uint *)(pPage->aData + (ulong)pPage->hdrOffset + 8);
        if ((uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) ==
            iFrom) {
          *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
               iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
          goto LAB_0012a4e6;
        }
      }
      bVar3 = false;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf320,
                  "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
    }
  }
  else {
LAB_0012a4e3:
    bVar3 = false;
  }
LAB_0012a4e6:
  if (bVar3) {
    return 0;
  }
  return iVar4;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_BKPT;
    }
    put4byte(pPage->aData, iTo);
  }else{
    int i;
    int nCell;
    int rc;

    rc = btreeInitPage(pPage);
    if( rc ) return rc;
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        pPage->xParseCell(pPage, pCell, &info);
        if( info.nLocal<info.nPayload ){
          if( pCell+info.nSize > pPage->aData+pPage->pBt->usableSize ){
            return SQLITE_CORRUPT_BKPT;
          }
          if( iFrom==get4byte(pCell+info.nSize-4) ){
            put4byte(pCell+info.nSize-4, iTo);
            break;
          }
        }
      }else{
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }
  
    if( i==nCell ){
      if( eType!=PTRMAP_BTREE || 
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_BKPT;
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }
  }
  return SQLITE_OK;
}